

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

long * __thiscall
google::protobuf::Map<std::__cxx11::string,long>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,long> *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  bool bVar1;
  LogMessage *pLVar2;
  const_pointer pvVar3;
  LogFinisher local_ba;
  byte local_b9;
  string local_b8;
  byte local_81;
  LogMessage local_80;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  key_arg<std::__cxx11::basic_string<char>_> *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find<std::__cxx11::string>((const_iterator *)local_30,this,key);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::end
            (&local_48,
             (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)this);
  bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
  local_81 = 0;
  local_b9 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    local_81 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_80,"CHECK failed: it != end(): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"key not found: ");
    std::__cxx11::string::string((string *)&local_b8,(string *)it.it_.bucket_index_);
    local_b9 = 1;
    pLVar2 = internal::LogMessage::operator<<(pLVar2,&local_b8);
    internal::LogFinisher::operator=(&local_ba,pLVar2);
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  pvVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
           ::const_iterator::operator->((const_iterator *)local_30);
  return (long *)(pvVar3 + 0x20);
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }